

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O3

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore>::~CommsBroker
          (CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore> *this)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  bool bVar6;
  timespec local_30;
  
  (this->super_CommonCore).super_Core._vptr_Core = (_func_int **)&PTR__CommsBroker_0054d8a0;
  (this->super_CommonCore).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_0054dc38;
  LOCK();
  (this->super_CommonCore).super_BrokerBase.haltOperations._M_base._M_i = true;
  UNLOCK();
  puVar1 = &(this->super_CommonCore).field_0xd84;
  LOCK();
  iVar2 = *(int *)puVar1;
  bVar6 = iVar2 == 2;
  if (bVar6) {
    *(undefined4 *)puVar1 = 3;
    iVar2 = 2;
  }
  UNLOCK();
  if (!bVar6) {
    do {
      if (iVar2 == 0) {
        puVar1 = &(this->super_CommonCore).field_0xd84;
        LOCK();
        bVar6 = *(int *)puVar1 == 0;
        if (bVar6) {
          *(undefined4 *)puVar1 = 1;
        }
        UNLOCK();
        iVar5 = 1;
        if (bVar6) {
          CommsInterface::disconnect
                    ((CommsInterface *)
                     (this->comms)._M_t.
                     super___uniq_ptr_impl<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::zeromq::ZmqComms_*,_std::default_delete<helics::zeromq::ZmqComms>_>
                     .super__Head_base<0UL,_helics::zeromq::ZmqComms_*,_false>._M_head_impl);
          LOCK();
          *(undefined4 *)&(this->super_CommonCore).field_0xd84 = 2;
          UNLOCK();
        }
      }
      else {
        local_30.tv_sec = 0;
        local_30.tv_nsec = 50000000;
        do {
          iVar3 = nanosleep(&local_30,&local_30);
          iVar5 = iVar2;
          if (iVar3 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
      puVar1 = &(this->super_CommonCore).field_0xd84;
      LOCK();
      iVar2 = *(int *)puVar1;
      bVar6 = iVar5 == iVar2;
      if (bVar6) {
        *(undefined4 *)puVar1 = 3;
        iVar2 = iVar5;
      }
      UNLOCK();
    } while (!bVar6);
  }
  std::__uniq_ptr_impl<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  reset((__uniq_ptr_impl<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
        )&this->comms,(pointer)0x0);
  BrokerBase::joinAllThreads(&(this->super_CommonCore).super_BrokerBase);
  std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  ~unique_ptr(&this->comms);
  CommonCore::~CommonCore(&this->super_CommonCore);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}